

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-shm-server.c
# Opt level: O0

int main(int argc,char **argv)

{
  int __fd;
  size_t sVar1;
  char *local_68;
  void *ptr;
  int shm_fd;
  int i;
  char *message [5];
  int SIZE;
  char *shm_name;
  char **argv_local;
  int argc_local;
  
  memcpy(&shm_fd,&DAT_00103dd0,0x28);
  __fd = shm_open("/AOS",0x42,0x1b6);
  if (__fd == 1) {
    printf("Shared memory segment failed\n");
    exit(1);
  }
  ftruncate(__fd,0x28);
  local_68 = (char *)mmap((void *)0x0,0x1000,3,1,__fd,0);
  if (local_68 == (char *)0xffffffffffffffff) {
    printf("Map failed\n");
    argv_local._4_4_ = 1;
  }
  else {
    ptr._4_4_ = 0;
    while( true ) {
      sVar1 = strlen(_shm_fd);
      if (sVar1 <= (ulong)(long)ptr._4_4_) break;
      sprintf(local_68,"%s",*(undefined8 *)(&shm_fd + (long)ptr._4_4_ * 2));
      sVar1 = strlen(*(char **)(&shm_fd + (long)ptr._4_4_ * 2));
      local_68 = local_68 + sVar1;
      ptr._4_4_ = ptr._4_4_ + 1;
    }
    munmap(local_68,0x1000);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char *argv[]) 
{
    const char * shm_name  = "/AOS";
    const int SIZE = 4096;
    const char * message[] = {"This ","is ","about ","shared ","memory"};
    int i, shm_fd;
    void * ptr;
    
    // ******** shm_open() ***************////// 
    //   shm_open()- opening/creation of a shared memory segment referenced by a name
    //        1) A special file will appear in the file-system under “/dev/shm/” with the provided name.
    //        2) The special file represents a POSIX object and it is created for persistence 
    //        3) ftruncate(...) function resize to memory region to the correct size
    
    shm_fd = shm_open(shm_name, O_CREAT | O_RDWR, 0666);
    
    if (shm_fd==1) 
    {
        printf("Shared memory segment failed\n");
        exit(1);
    }
    
    ftruncate(shm_fd, sizeof(message));
    
    // ******** shm_open() end ***************////// 
    
    // ******** mmap() ***************////// 
    // ******** mmap() – mapping of the memory segment referenced by the file descriptor returned by shm_open() ***************////// 
    
    ptr = mmap(0, SIZE, PROT_READ | PROT_WRITE, MAP_SHARED, shm_fd, 0);
    
    if (ptr == MAP_FAILED) 
    {
        printf("Map failed\n");
        return 1;
        
    }
    /* Write into the memory segment */
    for (i = 0; i < strlen(*message); ++i) 
    {
        sprintf(ptr, "%s", message[i]);
        ptr += strlen(message[i]);
        
    }
    // ******** munmap() ***************////// 
    // ******** munmap() – unmapping of the memory segment ***************////// 
    munmap(ptr, SIZE);
    
    return 0;
}